

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_jnt_convolve_avx2.c
# Opt level: O2

void av1_highbd_dist_wtd_convolve_2d_avx2
               (uint16_t *src,int src_stride,uint16_t *dst0,int dst_stride0,int w,int h,
               InterpFilterParams *filter_params_x,InterpFilterParams *filter_params_y,
               int subpel_x_qn,int subpel_y_qn,ConvolveParams *conv_params,int bd)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  undefined1 auVar4 [32];
  ushort uVar5;
  ushort uVar6;
  int iVar7;
  int iVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  char cVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  int iVar25;
  long lVar26;
  byte bVar27;
  byte bVar28;
  undefined2 uVar29;
  uint uVar30;
  undefined1 (*pauVar31) [32];
  undefined1 (*pauVar32) [32];
  undefined1 (*pauVar33) [16];
  undefined2 uVar34;
  int iVar35;
  undefined1 (*pauVar36) [32];
  long lVar37;
  long lVar38;
  int iVar39;
  long lVar40;
  int iVar41;
  undefined1 (*pauVar42) [16];
  int iVar43;
  long lVar44;
  undefined1 auVar45 [16];
  undefined1 auVar47 [64];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  __m256i coeffs_y [4];
  __m256i coeffs_x [4];
  int16_t im_block [1120];
  undefined1 (*local_ca8) [16];
  longlong local_a20;
  longlong lStack_a18;
  longlong lStack_a10;
  longlong lStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  __m256i local_9a0;
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [16];
  undefined1 auStack_910 [16];
  undefined1 local_900 [16];
  undefined1 auStack_8f0 [16];
  undefined1 local_8e0 [16];
  undefined1 auStack_8d0 [16];
  undefined1 local_8c0 [16];
  undefined1 auStack_8b0 [2176];
  undefined1 auVar46 [32];
  undefined1 auVar52 [32];
  
  bVar27 = (byte)conv_params->round_0;
  cVar17 = (char)bd;
  iVar39 = (1 << (cVar17 + 6U & 0x1f)) + ((1 << (bVar27 & 0x1f)) >> 1);
  iVar25 = conv_params->round_1 + conv_params->round_0;
  bVar28 = (cVar17 + '\x0e') - (char)iVar25;
  iVar35 = (-1 << (~bVar27 + cVar17 + 0xe & 0x1f)) +
           ((1 << ((byte)conv_params->round_1 & 0x1f)) >> 1);
  iVar41 = (1 << (bVar28 - 1 & 0x1f)) + (1 << (bVar28 & 0x1f));
  uVar30 = 0xe - iVar25;
  uVar5 = filter_params_y->taps;
  uVar34 = 0xff;
  if (bd == 0xc) {
    uVar34 = 0xfff;
  }
  uVar29 = 0x3ff;
  if (bd != 10) {
    uVar29 = uVar34;
  }
  iVar25 = conv_params->fwd_offset;
  iVar1 = conv_params->bck_offset;
  uVar2 = conv_params->round_0;
  uVar3 = conv_params->round_1;
  local_ca8 = (undefined1 (*) [16])conv_params->dst;
  lVar40 = (long)conv_params->dst_stride;
  iVar7 = conv_params->do_average;
  iVar8 = conv_params->use_dist_wtd_comp_avg;
  auVar45._2_2_ = uVar29;
  auVar45._0_2_ = uVar29;
  auVar45._4_2_ = uVar29;
  auVar45._6_2_ = uVar29;
  auVar45._8_2_ = uVar29;
  auVar45._10_2_ = uVar29;
  auVar45._12_2_ = uVar29;
  auVar45._14_2_ = uVar29;
  auVar46._16_2_ = uVar29;
  auVar46._0_16_ = auVar45;
  auVar46._18_2_ = uVar29;
  auVar46._20_2_ = uVar29;
  auVar46._22_2_ = uVar29;
  auVar46._24_2_ = uVar29;
  auVar46._26_2_ = uVar29;
  auVar46._28_2_ = uVar29;
  auVar46._30_2_ = uVar29;
  uVar6 = filter_params_x->taps;
  auVar47 = ZEXT1664(auVar45);
  prepare_coeffs(filter_params_x,subpel_x_qn,&local_9a0);
  prepare_coeffs(filter_params_y,subpel_y_qn,(__m256i *)&local_a20);
  iVar43 = ((1 << ((byte)uVar30 & 0x1f)) >> 1) - iVar41;
  lVar26 = (long)(int)(h + (uint)uVar5 + -1);
  lVar37 = (long)dst_stride0;
  pauVar31 = (undefined1 (*) [32])
             ((long)src +
             (2 - ((ulong)(uVar6 & 0xfffffffe) + (long)(int)(((uVar5 >> 1) - 1) * src_stride) * 2)))
  ;
  lVar38 = 0;
  do {
    if (w <= lVar38) {
      return;
    }
    pauVar36 = (undefined1 (*) [32])local_920;
    auVar48._4_4_ = iVar39;
    auVar48._0_4_ = iVar39;
    auVar48._8_4_ = iVar39;
    auVar48._12_4_ = iVar39;
    auVar48._16_4_ = iVar39;
    auVar48._20_4_ = iVar39;
    auVar48._24_4_ = iVar39;
    auVar48._28_4_ = iVar39;
    pauVar32 = pauVar31;
    for (lVar44 = 0; lVar44 < lVar26; lVar44 = lVar44 + 2) {
      auVar49 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
      if (lVar44 + 1 < lVar26) {
        auVar49 = *(undefined1 (*) [32])(*pauVar32 + (long)src_stride * 2);
      }
      auVar4 = *pauVar32;
      auVar51._0_16_ = ZEXT116(0) * auVar49._0_16_ + ZEXT116(1) * auVar4._0_16_;
      auVar51._16_16_ = ZEXT116(0) * auVar4._16_16_ + ZEXT116(1) * auVar49._0_16_;
      auVar16 = vperm2i128_avx2(auVar4,auVar49,0x31);
      auVar49 = vpalignr_avx2(auVar16,auVar51,4);
      auVar4 = vpalignr_avx2(auVar16,auVar51,8);
      auVar9 = vpalignr_avx2(auVar16,auVar51,0xc);
      auVar10 = vpmaddwd_avx2(auVar51,(undefined1  [32])local_9a0);
      auVar11 = vpmaddwd_avx2(local_980,auVar49);
      auVar49 = vpmaddwd_avx2(local_960,auVar4);
      auVar4 = vpmaddwd_avx2(auVar9,local_940);
      auVar49 = vpaddd_avx2(auVar4,auVar49);
      auVar4 = vpaddd_avx2(auVar10,auVar48);
      auVar4 = vpaddd_avx2(auVar4,auVar11);
      auVar49 = vpaddd_avx2(auVar4,auVar49);
      auVar49 = vpsrad_avx2(auVar49,ZEXT416(uVar2));
      auVar49 = vpackssdw_avx2(auVar49,auVar47._0_32_);
      auVar4 = vpalignr_avx2(auVar16,auVar51,2);
      auVar9 = vpalignr_avx2(auVar16,auVar51,6);
      auVar10 = vpalignr_avx2(auVar16,auVar51,10);
      auVar11 = vpalignr_avx2(auVar16,auVar51,0xe);
      auVar16 = vpmaddwd_avx2(auVar4,(undefined1  [32])local_9a0);
      auVar4 = vpmaddwd_avx2(auVar9,local_980);
      auVar9 = vpmaddwd_avx2(auVar10,local_960);
      auVar4 = vpaddd_avx2(auVar9,auVar4);
      auVar10 = vpmaddwd_avx2(auVar11,local_940);
      auVar9 = vpaddd_avx2(auVar48,auVar16);
      auVar4 = vpaddd_avx2(auVar9,auVar4);
      auVar4 = vpaddd_avx2(auVar4,auVar10);
      auVar4 = vpsrad_avx2(auVar4,ZEXT416(uVar2));
      auVar4 = vpackssdw_avx2(auVar4,auVar47._0_32_);
      auVar49 = vpunpcklwd_avx2(auVar49,auVar4);
      *pauVar36 = auVar49;
      pauVar36 = pauVar36 + 1;
      pauVar32 = (undefined1 (*) [32])(*pauVar32 + (long)src_stride * 4);
    }
    auVar49._16_16_ = auStack_910;
    auVar49._0_16_ = local_920;
    auVar4._16_16_ = local_900;
    auVar4._0_16_ = auStack_910;
    auVar16._16_16_ = auStack_8f0;
    auVar16._0_16_ = local_900;
    auVar14._16_16_ = local_8e0;
    auVar14._0_16_ = auStack_8f0;
    auVar15._16_16_ = auStack_8d0;
    auVar15._0_16_ = local_8e0;
    auVar55._16_16_ = local_8c0;
    auVar55._0_16_ = auStack_8d0;
    auVar9 = vpunpcklwd_avx2(auVar49,auVar4);
    auVar10 = vpunpcklwd_avx2(auVar16,auVar14);
    auVar11 = vpunpcklwd_avx2(auVar15,auVar55);
    auVar48 = vpunpckhwd_avx2(auVar49,auVar4);
    auVar49 = vpunpckhwd_avx2(auVar16,auVar14);
    auVar56 = ZEXT3264(CONCAT428(iVar35,CONCAT424(iVar35,CONCAT420(iVar35,CONCAT416(iVar35,CONCAT412
                                                  (iVar35,CONCAT48(iVar35,CONCAT44(iVar35,iVar35))))
                                                  ))));
    auVar4 = vpunpckhwd_avx2(auVar15,auVar55);
    pauVar36 = (undefined1 (*) [32])auStack_8b0;
    auVar57 = ZEXT3264(CONCAT824(lStack_a08,CONCAT816(lStack_a10,CONCAT88(lStack_a18,local_a20))));
    pauVar33 = local_ca8;
    pauVar42 = (undefined1 (*) [16])dst0;
    for (lVar44 = 0; auVar51 = auVar10, auVar16 = auVar49, lVar44 < h; lVar44 = lVar44 + 2) {
      auVar15 = vpunpcklwd_avx2(*(undefined1 (*) [32])(pauVar36[-1] + 0x10),*pauVar36);
      auVar47 = ZEXT3264(auVar15);
      auVar14 = vpunpckhwd_avx2(*(undefined1 (*) [32])(pauVar36[-1] + 0x10),*pauVar36);
      auVar9 = vpmaddwd_avx2(auVar57._0_32_,auVar9);
      auVar24._8_8_ = uStack_9f8;
      auVar24._0_8_ = local_a00;
      auVar24._16_8_ = uStack_9f0;
      auVar24._24_8_ = uStack_9e8;
      auVar49 = vpmaddwd_avx2(auVar24,auVar51);
      auVar12._8_8_ = uStack_9d8;
      auVar12._0_8_ = local_9e0;
      auVar12._16_8_ = uStack_9d0;
      auVar12._24_8_ = uStack_9c8;
      auVar10 = vpmaddwd_avx2(auVar11,auVar12);
      auVar49 = vpaddd_avx2(auVar49,auVar10);
      auVar13._8_8_ = uStack_9b8;
      auVar13._0_8_ = local_9c0;
      auVar13._16_8_ = uStack_9b0;
      auVar13._24_8_ = uStack_9a8;
      auVar10 = vpmaddwd_avx2(auVar13,auVar15);
      auVar55 = auVar56._0_32_;
      auVar9 = vpaddd_avx2(auVar9,auVar55);
      auVar49 = vpaddd_avx2(auVar9,auVar49);
      auVar49 = vpaddd_avx2(auVar49,auVar10);
      auVar49 = vpsrad_avx2(auVar49,ZEXT416(uVar3));
      auVar10._4_4_ = iVar41;
      auVar10._0_4_ = iVar41;
      auVar10._8_4_ = iVar41;
      auVar10._12_4_ = iVar41;
      auVar10._16_4_ = iVar41;
      auVar10._20_4_ = iVar41;
      auVar10._24_4_ = iVar41;
      auVar10._28_4_ = iVar41;
      auVar49 = vpaddd_avx2(auVar49,auVar10);
      auVar9._4_4_ = iVar1;
      auVar9._0_4_ = iVar1;
      auVar9._8_4_ = iVar1;
      auVar9._12_4_ = iVar1;
      auVar9._16_4_ = iVar1;
      auVar9._20_4_ = iVar1;
      auVar9._24_4_ = iVar1;
      auVar9._28_4_ = iVar1;
      auVar9 = vpmulld_avx2(auVar49,auVar9);
      auVar45 = ZEXT416(uVar30);
      if ((long)w + -8 < lVar38) {
        if (iVar7 == 0) {
          auVar48 = vpackusdw_avx2(auVar49,auVar15);
          *(long *)*pauVar33 = auVar48._0_8_;
          *(long *)(*pauVar33 + lVar40 * 2) = auVar48._16_8_;
        }
        else {
          auVar50._8_8_ = 0;
          auVar50._0_8_ = *(ulong *)(*pauVar33 + lVar40 * 2);
          auVar54._8_8_ = 0;
          auVar54._0_8_ = *(ulong *)*pauVar33;
          auVar52._0_16_ = ZEXT116(0) * auVar50 + ZEXT116(1) * auVar54;
          auVar52._16_16_ = ZEXT116(1) * auVar50;
          auVar48 = vpunpcklwd_avx2(auVar52,_DAT_00478a20);
          if (iVar8 == 0) {
            auVar48 = vpaddd_avx2(auVar49,auVar48);
            auVar48 = vpsrad_avx2(auVar48,1);
          }
          else {
            auVar18._4_4_ = iVar25;
            auVar18._0_4_ = iVar25;
            auVar18._8_4_ = iVar25;
            auVar18._12_4_ = iVar25;
            auVar18._16_4_ = iVar25;
            auVar18._20_4_ = iVar25;
            auVar18._24_4_ = iVar25;
            auVar18._28_4_ = iVar25;
            auVar48 = vpmulld_avx2(auVar48,auVar18);
            auVar48 = vpaddd_avx2(auVar48,auVar9);
            auVar48 = vpsrad_avx2(auVar48,4);
          }
          auVar20._4_4_ = iVar43;
          auVar20._0_4_ = iVar43;
          auVar20._8_4_ = iVar43;
          auVar20._12_4_ = iVar43;
          auVar20._16_4_ = iVar43;
          auVar20._20_4_ = iVar43;
          auVar20._24_4_ = iVar43;
          auVar20._28_4_ = iVar43;
          auVar48 = vpaddd_avx2(auVar48,auVar20);
          auVar48 = vpsrad_avx2(auVar48,auVar45);
          auVar48 = vpackusdw_avx2(auVar48,auVar48);
          auVar48 = vpminsw_avx2(auVar48,auVar46);
          *(long *)*pauVar42 = auVar48._0_8_;
          *(long *)((long)*pauVar42 + lVar37 * 2) = auVar48._16_8_;
LAB_003d851d:
          auVar56 = ZEXT3264(CONCAT428(iVar35,CONCAT424(iVar35,CONCAT420(iVar35,CONCAT416(iVar35,
                                                  CONCAT412(iVar35,CONCAT48(iVar35,CONCAT44(iVar35,
                                                  iVar35))))))));
        }
      }
      else {
        auVar10 = vpmaddwd_avx2(auVar48,auVar57._0_32_);
        auVar23._4_4_ = iVar41;
        auVar23._0_4_ = iVar41;
        auVar23._8_4_ = iVar41;
        auVar23._12_4_ = iVar41;
        auVar23._16_4_ = iVar41;
        auVar23._20_4_ = iVar41;
        auVar23._24_4_ = iVar41;
        auVar23._28_4_ = iVar41;
        auVar47 = ZEXT3264(auVar55);
        auVar48 = vpmaddwd_avx2(auVar16,auVar24);
        auVar12 = vpmaddwd_avx2(auVar4,auVar12);
        auVar48 = vpaddd_avx2(auVar12,auVar48);
        auVar13 = vpmaddwd_avx2(auVar13,auVar14);
        auVar10 = vpaddd_avx2(auVar10,auVar55);
        auVar48 = vpaddd_avx2(auVar10,auVar48);
        auVar48 = vpaddd_avx2(auVar13,auVar48);
        auVar48 = vpsrad_avx2(auVar48,ZEXT416(uVar3));
        auVar48 = vpaddd_avx2(auVar23,auVar48);
        if (iVar7 != 0) {
          auVar53._0_16_ =
               ZEXT116(0) * *(undefined1 (*) [16])(*pauVar33 + lVar40 * 2) + ZEXT116(1) * *pauVar33;
          auVar53._16_16_ =
               ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
               ZEXT116(1) * *(undefined1 (*) [16])(*pauVar33 + lVar40 * 2);
          auVar55 = vpunpcklwd_avx2(auVar53,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
          auVar10 = vpunpckhwd_avx2(auVar53,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
          if (iVar8 == 0) {
            auVar49 = vpaddd_avx2(auVar49,auVar55);
            auVar49 = vpsrad_avx2(auVar49,1);
            auVar48 = vpaddd_avx2(auVar48,auVar10);
            auVar48 = vpsrad_avx2(auVar48,1);
          }
          else {
            auVar19._4_4_ = iVar25;
            auVar19._0_4_ = iVar25;
            auVar19._8_4_ = iVar25;
            auVar19._12_4_ = iVar25;
            auVar19._16_4_ = iVar25;
            auVar19._20_4_ = iVar25;
            auVar19._24_4_ = iVar25;
            auVar19._28_4_ = iVar25;
            auVar49 = vpmulld_avx2(auVar19,auVar55);
            auVar49 = vpaddd_avx2(auVar49,auVar9);
            auVar49 = vpsrad_avx2(auVar49,4);
            auVar9 = vpmulld_avx2(auVar19,auVar10);
            auVar22._4_4_ = iVar1;
            auVar22._0_4_ = iVar1;
            auVar22._8_4_ = iVar1;
            auVar22._12_4_ = iVar1;
            auVar22._16_4_ = iVar1;
            auVar22._20_4_ = iVar1;
            auVar22._24_4_ = iVar1;
            auVar22._28_4_ = iVar1;
            auVar48 = vpmulld_avx2(auVar48,auVar22);
            auVar48 = vpaddd_avx2(auVar9,auVar48);
            auVar48 = vpsrad_avx2(auVar48,4);
          }
          auVar57 = ZEXT3264(CONCAT824(lStack_a08,
                                       CONCAT816(lStack_a10,CONCAT88(lStack_a18,local_a20))));
          auVar47 = ZEXT1664(auVar45);
          auVar21._4_4_ = iVar43;
          auVar21._0_4_ = iVar43;
          auVar21._8_4_ = iVar43;
          auVar21._12_4_ = iVar43;
          auVar21._16_4_ = iVar43;
          auVar21._20_4_ = iVar43;
          auVar21._24_4_ = iVar43;
          auVar21._28_4_ = iVar43;
          auVar49 = vpaddd_avx2(auVar21,auVar49);
          auVar49 = vpsrad_avx2(auVar49,auVar45);
          auVar48 = vpaddd_avx2(auVar21,auVar48);
          auVar48 = vpsrad_avx2(auVar48,auVar45);
          auVar48 = vpackusdw_avx2(auVar49,auVar48);
          auVar48 = vpminsw_avx2(auVar48,auVar46);
          *pauVar42 = auVar48._0_16_;
          *(undefined1 (*) [16])((long)*pauVar42 + lVar37 * 2) = auVar48._16_16_;
          goto LAB_003d851d;
        }
        auVar48 = vpackusdw_avx2(auVar49,auVar48);
        *pauVar33 = auVar48._0_16_;
        *(undefined1 (*) [16])(*pauVar33 + lVar40 * 2) = auVar48._16_16_;
        auVar56 = ZEXT3264(CONCAT428(iVar35,CONCAT424(iVar35,CONCAT420(iVar35,CONCAT416(iVar35,
                                                  CONCAT412(iVar35,CONCAT48(iVar35,CONCAT44(iVar35,
                                                  iVar35))))))));
        auVar57 = ZEXT3264(CONCAT824(lStack_a08,CONCAT816(lStack_a10,CONCAT88(lStack_a18,local_a20))
                                    ));
      }
      pauVar36 = pauVar36 + 1;
      pauVar33 = (undefined1 (*) [16])(*pauVar33 + lVar40 * 4);
      pauVar42 = (undefined1 (*) [16])((long)*pauVar42 + lVar37 * 2 * 2);
      auVar49 = auVar4;
      auVar10 = auVar11;
      auVar9 = auVar51;
      auVar48 = auVar16;
      auVar11 = auVar15;
      auVar4 = auVar14;
    }
    lVar38 = lVar38 + 8;
    pauVar31 = (undefined1 (*) [32])(*pauVar31 + 0x10);
    local_ca8 = local_ca8 + 1;
    dst0 = (uint16_t *)((long)dst0 + 0x10);
  } while( true );
}

Assistant:

void av1_highbd_dist_wtd_convolve_2d_avx2(
    const uint16_t *src, int src_stride, uint16_t *dst0, int dst_stride0, int w,
    int h, const InterpFilterParams *filter_params_x,
    const InterpFilterParams *filter_params_y, const int subpel_x_qn,
    const int subpel_y_qn, ConvolveParams *conv_params, int bd) {
  DECLARE_ALIGNED(32, int16_t, im_block[(MAX_SB_SIZE + MAX_FILTER_TAP) * 8]);
  CONV_BUF_TYPE *dst = conv_params->dst;
  int dst_stride = conv_params->dst_stride;
  int im_h = h + filter_params_y->taps - 1;
  int im_stride = 8;
  int i, j;
  const int fo_vert = filter_params_y->taps / 2 - 1;
  const int fo_horiz = filter_params_x->taps / 2 - 1;
  const uint16_t *const src_ptr = src - fo_vert * src_stride - fo_horiz;

  // Check that, even with 12-bit input, the intermediate values will fit
  // into an unsigned 16-bit intermediate array.
  assert(bd + FILTER_BITS + 2 - conv_params->round_0 <= 16);

  __m256i s[8], coeffs_y[4], coeffs_x[4];
  const int do_average = conv_params->do_average;
  const int use_dist_wtd_comp_avg = conv_params->use_dist_wtd_comp_avg;

  const int w0 = conv_params->fwd_offset;
  const int w1 = conv_params->bck_offset;
  const __m256i wt0 = _mm256_set1_epi32(w0);
  const __m256i wt1 = _mm256_set1_epi32(w1);
  const __m256i zero = _mm256_setzero_si256();

  const __m256i round_const_x = _mm256_set1_epi32(
      ((1 << conv_params->round_0) >> 1) + (1 << (bd + FILTER_BITS - 1)));
  const __m128i round_shift_x = _mm_cvtsi32_si128(conv_params->round_0);

  const __m256i round_const_y = _mm256_set1_epi32(
      ((1 << conv_params->round_1) >> 1) -
      (1 << (bd + 2 * FILTER_BITS - conv_params->round_0 - 1)));
  const __m128i round_shift_y = _mm_cvtsi32_si128(conv_params->round_1);

  const int offset_0 =
      bd + 2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset = (1 << offset_0) + (1 << (offset_0 - 1));
  const __m256i offset_const = _mm256_set1_epi32(offset);
  const int rounding_shift =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const __m256i rounding_const = _mm256_set1_epi32((1 << rounding_shift) >> 1);

  const __m256i clip_pixel_to_bd =
      _mm256_set1_epi16(bd == 10 ? 1023 : (bd == 12 ? 4095 : 255));

  prepare_coeffs(filter_params_x, subpel_x_qn, coeffs_x);
  prepare_coeffs(filter_params_y, subpel_y_qn, coeffs_y);

  for (j = 0; j < w; j += 8) {
    /* Horizontal filter */
    {
      for (i = 0; i < im_h; i += 2) {
        const __m256i row0 =
            _mm256_loadu_si256((__m256i *)&src_ptr[i * src_stride + j]);
        __m256i row1 = _mm256_setzero_si256();
        if (i + 1 < im_h)
          row1 =
              _mm256_loadu_si256((__m256i *)&src_ptr[(i + 1) * src_stride + j]);

        const __m256i r0 = _mm256_permute2x128_si256(row0, row1, 0x20);
        const __m256i r1 = _mm256_permute2x128_si256(row0, row1, 0x31);

        // even pixels
        s[0] = _mm256_alignr_epi8(r1, r0, 0);
        s[1] = _mm256_alignr_epi8(r1, r0, 4);
        s[2] = _mm256_alignr_epi8(r1, r0, 8);
        s[3] = _mm256_alignr_epi8(r1, r0, 12);

        __m256i res_even = convolve(s, coeffs_x);
        res_even = _mm256_sra_epi32(_mm256_add_epi32(res_even, round_const_x),
                                    round_shift_x);

        // odd pixels
        s[0] = _mm256_alignr_epi8(r1, r0, 2);
        s[1] = _mm256_alignr_epi8(r1, r0, 6);
        s[2] = _mm256_alignr_epi8(r1, r0, 10);
        s[3] = _mm256_alignr_epi8(r1, r0, 14);

        __m256i res_odd = convolve(s, coeffs_x);
        res_odd = _mm256_sra_epi32(_mm256_add_epi32(res_odd, round_const_x),
                                   round_shift_x);

        __m256i res_even1 = _mm256_packs_epi32(res_even, res_even);
        __m256i res_odd1 = _mm256_packs_epi32(res_odd, res_odd);
        __m256i res = _mm256_unpacklo_epi16(res_even1, res_odd1);

        _mm256_store_si256((__m256i *)&im_block[i * im_stride], res);
      }
    }

    /* Vertical filter */
    {
      __m256i s0 = _mm256_loadu_si256((__m256i *)(im_block + 0 * im_stride));
      __m256i s1 = _mm256_loadu_si256((__m256i *)(im_block + 1 * im_stride));
      __m256i s2 = _mm256_loadu_si256((__m256i *)(im_block + 2 * im_stride));
      __m256i s3 = _mm256_loadu_si256((__m256i *)(im_block + 3 * im_stride));
      __m256i s4 = _mm256_loadu_si256((__m256i *)(im_block + 4 * im_stride));
      __m256i s5 = _mm256_loadu_si256((__m256i *)(im_block + 5 * im_stride));

      s[0] = _mm256_unpacklo_epi16(s0, s1);
      s[1] = _mm256_unpacklo_epi16(s2, s3);
      s[2] = _mm256_unpacklo_epi16(s4, s5);

      s[4] = _mm256_unpackhi_epi16(s0, s1);
      s[5] = _mm256_unpackhi_epi16(s2, s3);
      s[6] = _mm256_unpackhi_epi16(s4, s5);

      for (i = 0; i < h; i += 2) {
        const int16_t *data = &im_block[i * im_stride];

        const __m256i s6 =
            _mm256_loadu_si256((__m256i *)(data + 6 * im_stride));
        const __m256i s7 =
            _mm256_loadu_si256((__m256i *)(data + 7 * im_stride));

        s[3] = _mm256_unpacklo_epi16(s6, s7);
        s[7] = _mm256_unpackhi_epi16(s6, s7);

        const __m256i res_a = convolve(s, coeffs_y);

        const __m256i res_a_round = _mm256_sra_epi32(
            _mm256_add_epi32(res_a, round_const_y), round_shift_y);

        const __m256i res_unsigned_lo =
            _mm256_add_epi32(res_a_round, offset_const);

        if (w - j < 8) {
          if (do_average) {
            const __m256i data_0 = _mm256_castsi128_si256(
                _mm_loadl_epi64((__m128i *)(&dst[i * dst_stride + j])));
            const __m256i data_1 = _mm256_castsi128_si256(_mm_loadl_epi64(
                (__m128i *)(&dst[i * dst_stride + j + dst_stride])));
            const __m256i data_01 =
                _mm256_permute2x128_si256(data_0, data_1, 0x20);

            const __m256i data_ref_0 = _mm256_unpacklo_epi16(data_01, zero);

            const __m256i comp_avg_res =
                highbd_comp_avg(&data_ref_0, &res_unsigned_lo, &wt0, &wt1,
                                use_dist_wtd_comp_avg);

            const __m256i round_result = highbd_convolve_rounding(
                &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

            const __m256i res_16b =
                _mm256_packus_epi32(round_result, round_result);
            const __m256i res_clip =
                _mm256_min_epi16(res_16b, clip_pixel_to_bd);

            const __m128i res_0 = _mm256_castsi256_si128(res_clip);
            const __m128i res_1 = _mm256_extracti128_si256(res_clip, 1);

            _mm_storel_epi64((__m128i *)(&dst0[i * dst_stride0 + j]), res_0);
            _mm_storel_epi64(
                (__m128i *)(&dst0[i * dst_stride0 + j + dst_stride0]), res_1);
          } else {
            __m256i res_16b =
                _mm256_packus_epi32(res_unsigned_lo, res_unsigned_lo);
            const __m128i res_0 = _mm256_castsi256_si128(res_16b);
            const __m128i res_1 = _mm256_extracti128_si256(res_16b, 1);

            _mm_storel_epi64((__m128i *)(&dst[i * dst_stride + j]), res_0);
            _mm_storel_epi64((__m128i *)(&dst[i * dst_stride + j + dst_stride]),
                             res_1);
          }
        } else {
          const __m256i res_b = convolve(s + 4, coeffs_y);
          const __m256i res_b_round = _mm256_sra_epi32(
              _mm256_add_epi32(res_b, round_const_y), round_shift_y);

          __m256i res_unsigned_hi = _mm256_add_epi32(res_b_round, offset_const);

          if (do_average) {
            const __m256i data_0 = _mm256_castsi128_si256(
                _mm_loadu_si128((__m128i *)(&dst[i * dst_stride + j])));
            const __m256i data_1 = _mm256_castsi128_si256(_mm_loadu_si128(
                (__m128i *)(&dst[i * dst_stride + j + dst_stride])));
            const __m256i data_01 =
                _mm256_permute2x128_si256(data_0, data_1, 0x20);

            const __m256i data_ref_0_lo = _mm256_unpacklo_epi16(data_01, zero);
            const __m256i data_ref_0_hi = _mm256_unpackhi_epi16(data_01, zero);

            const __m256i comp_avg_res_lo =
                highbd_comp_avg(&data_ref_0_lo, &res_unsigned_lo, &wt0, &wt1,
                                use_dist_wtd_comp_avg);
            const __m256i comp_avg_res_hi =
                highbd_comp_avg(&data_ref_0_hi, &res_unsigned_hi, &wt0, &wt1,
                                use_dist_wtd_comp_avg);

            const __m256i round_result_lo =
                highbd_convolve_rounding(&comp_avg_res_lo, &offset_const,
                                         &rounding_const, rounding_shift);
            const __m256i round_result_hi =
                highbd_convolve_rounding(&comp_avg_res_hi, &offset_const,
                                         &rounding_const, rounding_shift);

            const __m256i res_16b =
                _mm256_packus_epi32(round_result_lo, round_result_hi);
            const __m256i res_clip =
                _mm256_min_epi16(res_16b, clip_pixel_to_bd);

            const __m128i res_0 = _mm256_castsi256_si128(res_clip);
            const __m128i res_1 = _mm256_extracti128_si256(res_clip, 1);

            _mm_store_si128((__m128i *)(&dst0[i * dst_stride0 + j]), res_0);
            _mm_store_si128(
                (__m128i *)(&dst0[i * dst_stride0 + j + dst_stride0]), res_1);
          } else {
            __m256i res_16b =
                _mm256_packus_epi32(res_unsigned_lo, res_unsigned_hi);
            const __m128i res_0 = _mm256_castsi256_si128(res_16b);
            const __m128i res_1 = _mm256_extracti128_si256(res_16b, 1);

            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]), res_0);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j + dst_stride]),
                            res_1);
          }
        }

        s[0] = s[1];
        s[1] = s[2];
        s[2] = s[3];

        s[4] = s[5];
        s[5] = s[6];
        s[6] = s[7];
      }
    }
  }
}